

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oplintf.c
# Opt level: O1

UINT8 device_start_ym3812_nuked(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  DEV_DATA chip;
  UINT8 UVar2;
  UINT32 rate;
  
  uVar1 = cfg->clock;
  if ((cfg->srMode == '\x01') ||
     ((rate = uVar1 / 0x48, cfg->srMode == '\x02' && (uVar1 / 0x48 < cfg->smplRate)))) {
    rate = cfg->smplRate;
  }
  chip.chipInf = nukedopl3_init(uVar1 * 4,rate);
  if ((DEV_DATA *)chip.chipInf == (DEV_DATA *)0x0) {
    UVar2 = 0xff;
  }
  else {
    nukedopl3_set_volume(chip.chipInf,0x10000);
    UVar2 = '\0';
    nukedopl3_set_mute_mask(chip.chipInf,0);
    *(void **)chip.chipInf = chip.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)chip.chipInf;
    retDevInf->sampleRate = rate;
    retDevInf->devDef = &devDef3812_Nuked;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar2;
}

Assistant:

static UINT8 device_start_ym3812_nuked(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	void* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 72;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = nukedopl3_init(cfg->clock * 4, rate);
	if (chip == NULL)
		return 0xFF;
	
	nukedopl3_set_volume(chip, 0x10000);
	nukedopl3_set_mute_mask(chip, 0x000000);
	
	devData = (DEV_DATA*)chip;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef3812_Nuked);
	return 0x00;
}